

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpRequest.cpp
# Opt level: O2

string * __thiscall
higan::HttpRequest::operator[](string *__return_storage_ptr__,HttpRequest *this,string *key)

{
  const_iterator cVar1;
  allocator<char> local_19;
  
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(this->headers_)._M_t,key);
  if ((_Rb_tree_header *)cVar1._M_node == &(this->headers_)._M_t._M_impl.super__Rb_tree_header) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_19);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)(cVar1._M_node + 2));
  }
  return __return_storage_ptr__;
}

Assistant:

std::string HttpRequest::operator[](const std::string& key) const
{
	auto result = headers_.find(key);
	if (result != headers_.end())
	{
		return result->second;
	}
	return "";
}